

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O3

string * __thiscall
cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_
          (string *__return_storage_ptr__,cmPolicies *this,PolicyID id)

{
  long *plVar1;
  char *pcVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string pid;
  long *local_f8;
  undefined8 local_f0;
  long local_e8 [2];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_d8;
  undefined8 local_c0;
  long *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined8 local_98;
  size_t local_90;
  char *local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  undefined8 local_60;
  long *local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  pcVar2 = idToString((PolicyID)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,pcVar2,(allocator<char> *)&local_d8);
  pcVar2 = idToVersion((PolicyID)this);
  plVar1 = local_f8;
  local_d8.first._M_len = 7;
  local_d8.first._M_str = "Policy ";
  local_d8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_c0 = local_f0;
  local_b8 = local_f8;
  local_b0 = 0;
  local_a8 = 0x81;
  local_a0 = 
  " may not be set to OLD behavior because this version of CMake no longer supports it.  The policy was introduced in CMake version "
  ;
  local_98 = 0;
  local_90 = strlen(pcVar2);
  local_80 = 0;
  local_78 = 0xd9;
  local_70 = 
  ", and use of NEW behavior is now required.\nPlease either update your CMakeLists.txt files to conform to the new behavior or use an older version of CMake that still supports the old behavior.  Run cmake --help-policy "
  ;
  local_68 = 0;
  local_60 = local_f0;
  local_58 = plVar1;
  local_50 = 0;
  local_48 = 0x16;
  local_40 = " for more information.";
  local_38 = 0;
  views._M_len = 7;
  views._M_array = &local_d8;
  local_88 = pcVar2;
  cmCatViews(__return_storage_ptr__,views);
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmPolicies::GetRequiredAlwaysPolicyError(cmPolicies::PolicyID id)
{
  std::string pid = idToString(id);
  return cmStrCat(
    "Policy ", pid,
    " may not be set to OLD behavior because this "
    "version of CMake no longer supports it.  "
    "The policy was introduced in CMake version ",
    idToVersion(id),
    ", and use of NEW behavior is now required."
    "\n"
    "Please either update your CMakeLists.txt files to conform to "
    "the new behavior or use an older version of CMake that still "
    "supports the old behavior.  Run cmake --help-policy ",
    pid, " for more information.");
}